

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::MidiMessage(MidiMessage *this,int command,int p1)

{
  value_type vVar1;
  reference pvVar2;
  allocator<unsigned_char> local_19;
  int local_18;
  int local_14;
  int p1_local;
  int command_local;
  MidiMessage *this_local;
  
  local_18 = p1;
  local_14 = command;
  _p1_local = this;
  std::allocator<unsigned_char>::allocator(&local_19);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2,&local_19);
  std::allocator<unsigned_char>::~allocator(&local_19);
  vVar1 = (value_type)local_14;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  *pvVar2 = vVar1;
  vVar1 = (value_type)local_18;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
  *pvVar2 = vVar1;
  return;
}

Assistant:

MidiMessage::MidiMessage(int command, int p1) : vector<uchar>(2) {
	(*this)[0] = (uchar)command;
	(*this)[1] = (uchar)p1;
}